

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O1

ScalarFunctionSet * duckdb::DatePartFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_true> *this;
  pointer pSVar1;
  LogicalType varargs;
  LogicalType varargs_00;
  LogicalType varargs_01;
  LogicalType varargs_02;
  LogicalType varargs_03;
  ScalarFunctionSet *in_RDI;
  long lVar2;
  ScalarFunction *func;
  pointer function;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  initializer_list<duckdb::LogicalType> __l_01;
  initializer_list<duckdb::LogicalType> __l_02;
  initializer_list<duckdb::LogicalType> __l_03;
  undefined4 in_stack_fffffffffffff134;
  undefined4 in_stack_fffffffffffff13c;
  FunctionNullHandling in_stack_fffffffffffff148;
  allocator_type local_eb1;
  bind_lambda_function_t in_stack_fffffffffffff150;
  LogicalType local_e98;
  ScalarFunctionSet *local_e80;
  scalar_function_t local_e78;
  scalar_function_t local_e58;
  scalar_function_t local_e38;
  scalar_function_t local_e18;
  scalar_function_t local_df8;
  LogicalType local_dd8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_dc0;
  LogicalType local_da8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_d90;
  LogicalType local_d78;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_d60;
  LogicalType local_d48;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_d30;
  LogicalType local_d18;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_d00;
  LogicalType local_ce8;
  LogicalType local_cd0;
  LogicalType local_cb8;
  LogicalType local_ca0;
  LogicalType local_c88;
  ScalarFunction local_c70;
  ScalarFunction local_b48;
  ScalarFunction local_a20;
  ScalarFunction local_8f8;
  ScalarFunction local_7d0;
  ScalarFunction local_6a8;
  ScalarFunction local_580;
  ScalarFunction local_458;
  ScalarFunction local_330;
  ScalarFunction local_208;
  BaseScalarFunction local_e0;
  
  ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  local_e80 = in_RDI;
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffff150,VARCHAR);
  LogicalType::LogicalType(&local_e98,DATE);
  __l._M_len = 2;
  __l._M_array = (LogicalType *)&stack0xfffffffffffff150;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_d00,__l,&local_eb1);
  LogicalType::LogicalType(&local_d18,BIGINT);
  local_df8.super__Function_base._M_functor._8_8_ = 0;
  local_df8.super__Function_base._M_functor._M_unused._M_object = DatePartFunction<duckdb::date_t>;
  local_df8._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_df8.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_c88,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_c88;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffff134;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_fffffffffffff13c;
  ScalarFunction::ScalarFunction
            (&local_208,(vector<duckdb::LogicalType,_true> *)&local_d00,&local_d18,&local_df8,
             DatePartBind,(bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
             (init_local_state_t)0x0,varargs,CONSISTENT,in_stack_fffffffffffff148,
             in_stack_fffffffffffff150);
  this = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_208);
  local_208.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01998f18;
  if (local_208.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_208.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_208.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_208.function.super__Function_base._M_manager)
              ((_Any_data *)&local_208.function,(_Any_data *)&local_208.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_208.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_c88);
  if (local_df8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_df8.super__Function_base._M_manager)
              ((_Any_data *)&local_df8,(_Any_data *)&local_df8,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_d18);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_d00);
  lVar2 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&stack0xfffffffffffff150 + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffff150,VARCHAR);
  LogicalType::LogicalType(&local_e98,TIMESTAMP);
  __l_00._M_len = 2;
  __l_00._M_array = (LogicalType *)&stack0xfffffffffffff150;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_d30,__l_00,&local_eb1);
  LogicalType::LogicalType(&local_d48,BIGINT);
  local_e18.super__Function_base._M_functor._8_8_ = 0;
  local_e18.super__Function_base._M_functor._M_unused._M_object =
       DatePartFunction<duckdb::timestamp_t>;
  local_e18._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_e18.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_ca0,INVALID);
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_00._0_8_ = &local_ca0;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffff134;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffff13c;
  ScalarFunction::ScalarFunction
            (&local_330,(vector<duckdb::LogicalType,_true> *)&local_d30,&local_d48,&local_e18,
             DatePartBind,(bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
             (init_local_state_t)0x0,varargs_00,CONSISTENT,in_stack_fffffffffffff148,
             in_stack_fffffffffffff150);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_330);
  local_330.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01998f18;
  if (local_330.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_330.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_330.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_330.function.super__Function_base._M_manager)
              ((_Any_data *)&local_330.function,(_Any_data *)&local_330.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_330.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_ca0);
  if (local_e18.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_e18.super__Function_base._M_manager)
              ((_Any_data *)&local_e18,(_Any_data *)&local_e18,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_d48);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_d30);
  lVar2 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&stack0xfffffffffffff150 + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffff150,VARCHAR);
  LogicalType::LogicalType(&local_e98,TIME);
  __l_01._M_len = 2;
  __l_01._M_array = (LogicalType *)&stack0xfffffffffffff150;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_d60,__l_01,&local_eb1);
  LogicalType::LogicalType(&local_d78,BIGINT);
  local_e38.super__Function_base._M_functor._8_8_ = 0;
  local_e38.super__Function_base._M_functor._M_unused._M_object = DatePartFunction<duckdb::dtime_t>;
  local_e38._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_e38.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_cb8,INVALID);
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_01._0_8_ = &local_cb8;
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffff134;
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffff13c;
  ScalarFunction::ScalarFunction
            (&local_458,(vector<duckdb::LogicalType,_true> *)&local_d60,&local_d78,&local_e38,
             DatePartBind,(bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
             (init_local_state_t)0x0,varargs_01,CONSISTENT,in_stack_fffffffffffff148,
             in_stack_fffffffffffff150);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_458);
  local_458.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01998f18;
  if (local_458.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_458.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_458.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_458.function.super__Function_base._M_manager)
              ((_Any_data *)&local_458.function,(_Any_data *)&local_458.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_458.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_cb8);
  if (local_e38.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_e38.super__Function_base._M_manager)
              ((_Any_data *)&local_e38,(_Any_data *)&local_e38,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_d78);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_d60);
  lVar2 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&stack0xfffffffffffff150 + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffff150,VARCHAR);
  LogicalType::LogicalType(&local_e98,INTERVAL);
  __l_02._M_len = 2;
  __l_02._M_array = (LogicalType *)&stack0xfffffffffffff150;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_d90,__l_02,&local_eb1);
  LogicalType::LogicalType(&local_da8,BIGINT);
  local_e58.super__Function_base._M_functor._8_8_ = 0;
  local_e58.super__Function_base._M_functor._M_unused._M_object =
       DatePartFunction<duckdb::interval_t>;
  local_e58._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_e58.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_cd0,INVALID);
  varargs_02.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_02._0_8_ = &local_cd0;
  varargs_02.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffff134;
  varargs_02.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_02.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffff13c;
  ScalarFunction::ScalarFunction
            (&local_580,(vector<duckdb::LogicalType,_true> *)&local_d90,&local_da8,&local_e58,
             DatePartBind,(bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
             (init_local_state_t)0x0,varargs_02,CONSISTENT,in_stack_fffffffffffff148,
             in_stack_fffffffffffff150);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_580);
  local_580.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01998f18;
  if (local_580.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_580.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_580.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_580.function.super__Function_base._M_manager)
              ((_Any_data *)&local_580.function,(_Any_data *)&local_580.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_580.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_cd0);
  if (local_e58.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_e58.super__Function_base._M_manager)
              ((_Any_data *)&local_e58,(_Any_data *)&local_e58,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_da8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_d90);
  lVar2 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&stack0xfffffffffffff150 + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffff150,VARCHAR);
  LogicalType::LogicalType(&local_e98,TIME_TZ);
  __l_03._M_len = 2;
  __l_03._M_array = (iterator)&stack0xfffffffffffff150;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_dc0,__l_03,&local_eb1);
  LogicalType::LogicalType(&local_dd8,BIGINT);
  local_e78.super__Function_base._M_functor._8_8_ = 0;
  local_e78.super__Function_base._M_functor._M_unused._M_object =
       DatePartFunction<duckdb::dtime_tz_t>;
  local_e78._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_e78.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_ce8,INVALID);
  varargs_03.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_03._0_8_ = &local_ce8;
  varargs_03.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffff134;
  varargs_03.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_03.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffff13c;
  ScalarFunction::ScalarFunction
            (&local_6a8,(vector<duckdb::LogicalType,_true> *)&local_dc0,&local_dd8,&local_e78,
             DatePartBind,(bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
             (init_local_state_t)0x0,varargs_03,CONSISTENT,in_stack_fffffffffffff148,
             in_stack_fffffffffffff150);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_6a8);
  local_6a8.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01998f18;
  if (local_6a8.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_6a8.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_6a8.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_6a8.function.super__Function_base._M_manager)
              ((_Any_data *)&local_6a8.function,(_Any_data *)&local_6a8.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_6a8.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_ce8);
  if (local_e78.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_e78.super__Function_base._M_manager)
              ((_Any_data *)&local_e78,(_Any_data *)&local_e78,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_dd8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_dc0);
  lVar2 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&stack0xfffffffffffff150 + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffff150,DATE);
  StructDatePart::GetFunction<duckdb::date_t>(&local_7d0,(LogicalType *)&stack0xfffffffffffff150);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_7d0);
  local_7d0.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01998f18;
  if (local_7d0.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_7d0.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_7d0.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_7d0.function.super__Function_base._M_manager)
              ((_Any_data *)&local_7d0.function,(_Any_data *)&local_7d0.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_7d0.super_BaseScalarFunction);
  LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffff150);
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffff150,TIMESTAMP);
  StructDatePart::GetFunction<duckdb::timestamp_t>
            (&local_8f8,(LogicalType *)&stack0xfffffffffffff150);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_8f8);
  local_8f8.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01998f18;
  if (local_8f8.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_8f8.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_8f8.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_8f8.function.super__Function_base._M_manager)
              ((_Any_data *)&local_8f8.function,(_Any_data *)&local_8f8.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_8f8.super_BaseScalarFunction);
  LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffff150);
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffff150,TIME);
  StructDatePart::GetFunction<duckdb::dtime_t>(&local_a20,(LogicalType *)&stack0xfffffffffffff150);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_a20);
  local_a20.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01998f18;
  if (local_a20.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a20.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_a20.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_a20.function.super__Function_base._M_manager)
              ((_Any_data *)&local_a20.function,(_Any_data *)&local_a20.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_a20.super_BaseScalarFunction);
  LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffff150);
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffff150,INTERVAL);
  StructDatePart::GetFunction<duckdb::interval_t>
            (&local_b48,(LogicalType *)&stack0xfffffffffffff150);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_b48);
  local_b48.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01998f18;
  if (local_b48.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b48.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_b48.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_b48.function.super__Function_base._M_manager)
              ((_Any_data *)&local_b48.function,(_Any_data *)&local_b48.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_b48.super_BaseScalarFunction);
  LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffff150);
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffff150,TIME_TZ);
  StructDatePart::GetFunction<duckdb::dtime_tz_t>
            (&local_c70,(LogicalType *)&stack0xfffffffffffff150);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_c70);
  local_c70.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01998f18;
  if (local_c70.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c70.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_c70.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_c70.function.super__Function_base._M_manager)
              ((_Any_data *)&local_c70.function,(_Any_data *)&local_c70.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_c70.super_BaseScalarFunction);
  LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffff150);
  function = (local_e80->super_FunctionSet<duckdb::ScalarFunction>).functions.
             super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
             super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
             _M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (local_e80->super_FunctionSet<duckdb::ScalarFunction>).functions.
           super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (function != pSVar1) {
    do {
      BaseScalarFunction::SetReturnsError(&local_e0,&function->super_BaseScalarFunction);
      BaseScalarFunction::~BaseScalarFunction(&local_e0);
      function = function + 1;
    } while (function != pSVar1);
  }
  return local_e80;
}

Assistant:

ScalarFunctionSet DatePartFun::GetFunctions() {
	ScalarFunctionSet date_part;
	date_part.AddFunction(ScalarFunction({LogicalType::VARCHAR, LogicalType::DATE}, LogicalType::BIGINT,
	                                     DatePartFunction<date_t>, DatePartBind));
	date_part.AddFunction(ScalarFunction({LogicalType::VARCHAR, LogicalType::TIMESTAMP}, LogicalType::BIGINT,
	                                     DatePartFunction<timestamp_t>, DatePartBind));
	date_part.AddFunction(ScalarFunction({LogicalType::VARCHAR, LogicalType::TIME}, LogicalType::BIGINT,
	                                     DatePartFunction<dtime_t>, DatePartBind));
	date_part.AddFunction(ScalarFunction({LogicalType::VARCHAR, LogicalType::INTERVAL}, LogicalType::BIGINT,
	                                     DatePartFunction<interval_t>, DatePartBind));
	date_part.AddFunction(ScalarFunction({LogicalType::VARCHAR, LogicalType::TIME_TZ}, LogicalType::BIGINT,
	                                     DatePartFunction<dtime_tz_t>, DatePartBind));

	// struct variants
	date_part.AddFunction(StructDatePart::GetFunction<date_t>(LogicalType::DATE));
	date_part.AddFunction(StructDatePart::GetFunction<timestamp_t>(LogicalType::TIMESTAMP));
	date_part.AddFunction(StructDatePart::GetFunction<dtime_t>(LogicalType::TIME));
	date_part.AddFunction(StructDatePart::GetFunction<interval_t>(LogicalType::INTERVAL));
	date_part.AddFunction(StructDatePart::GetFunction<dtime_tz_t>(LogicalType::TIME_TZ));

	for (auto &func : date_part.functions) {
		BaseScalarFunction::SetReturnsError(func);
	}

	return date_part;
}